

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdecompresshelper.cpp
# Opt level: O0

bool __thiscall QDecompressHelper::countInternal(QDecompressHelper *this)

{
  bool bVar1;
  qint64 qVar2;
  char *maxSize;
  qsizetype qVar3;
  pointer this_00;
  pointer pvVar4;
  void *__buf;
  ssize_t sVar5;
  QDecompressHelper *in_RCX;
  QDecompressHelper *in_RDI;
  long in_FS_OFFSET;
  qsizetype bytesRead_1;
  qsizetype bytesRead;
  qsizetype toRead;
  QByteArray buffer;
  array<char,_1024UL> temp;
  QByteArray *in_stack_fffffffffffffb78;
  undefined7 in_stack_fffffffffffffb80;
  undefined1 in_stack_fffffffffffffb87;
  undefined7 in_stack_fffffffffffffba0;
  undefined1 uVar6;
  byte local_421;
  QByteArray local_420;
  array<char,_1024UL> local_408;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    bVar1 = hasDataInternal((QDecompressHelper *)
                            CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80));
    in_RCX = (QDecompressHelper *)CONCAT71((int7)((ulong)in_RCX >> 8),bVar1);
    uVar6 = false;
    if (bVar1) {
      in_RCX = in_RDI;
      qVar2 = QByteDataBuffer::byteAmount(&in_RDI->decompressedDataBuffer);
      uVar6 = qVar2 < in_RCX->MaxDecompressedDataBufferSize;
      in_RDI = in_RCX;
    }
    if ((bool)uVar6 == false) {
      bVar1 = hasDataInternal((QDecompressHelper *)
                              CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80));
      if (bVar1) goto LAB_002a97a6;
      local_421 = 1;
      break;
    }
    local_420.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_420.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
    local_420.d.size = -0x5555555555555556;
    QByteArray::QByteArray(&local_420,0x40000,Uninitialized);
    maxSize = QByteArray::data((QByteArray *)
                               CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80));
    QByteArray::size(&local_420);
    qVar3 = readInternal(in_RDI,(char *)CONCAT17(uVar6,in_stack_fffffffffffffba0),(qsizetype)maxSize
                        );
    if (qVar3 != -1) {
      QByteArray::truncate((longlong)&local_420);
      QByteDataBuffer::append
                ((QByteDataBuffer *)CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80),
                 in_stack_fffffffffffffb78);
    }
    else {
      local_421 = 0;
    }
    QByteArray::~QByteArray((QByteArray *)0x2a9778);
  } while (qVar3 != -1);
  goto LAB_002a983b;
  while( true ) {
    memset(&local_408,0xaa,0x400);
    this_00 = std::unique_ptr<QDecompressHelper,_std::default_delete<QDecompressHelper>_>::
              operator->((unique_ptr<QDecompressHelper,_std::default_delete<QDecompressHelper>_> *)
                         0x2a97e7);
    pvVar4 = std::array<char,_1024UL>::data((array<char,_1024UL> *)0x2a97f9);
    __buf = (void *)std::array<char,_1024UL>::size(&local_408);
    sVar5 = read(this_00,(int)pvVar4,__buf,(size_t)in_RCX);
    if (sVar5 == -1) break;
LAB_002a97a6:
    std::unique_ptr<QDecompressHelper,_std::default_delete<QDecompressHelper>_>::operator->
              ((unique_ptr<QDecompressHelper,_std::default_delete<QDecompressHelper>_> *)0x2a97b4);
    bVar1 = hasData((QDecompressHelper *)
                    CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80));
    if (!bVar1) {
      local_421 = 1;
      goto LAB_002a983b;
    }
  }
  local_421 = 0;
LAB_002a983b:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_421 & 1);
}

Assistant:

bool QDecompressHelper::countInternal()
{
    Q_ASSERT(countDecompressed);
    while (hasDataInternal()
           && decompressedDataBuffer.byteAmount() < MaxDecompressedDataBufferSize) {
        const qsizetype toRead = 256 * 1024;
        QByteArray buffer(toRead, Qt::Uninitialized);
        qsizetype bytesRead = readInternal(buffer.data(), buffer.size());
        if (bytesRead == -1)
            return false;
        buffer.truncate(bytesRead);
        decompressedDataBuffer.append(std::move(buffer));
    }
    if (!hasDataInternal())
        return true; // handled all the data so far, just return

    while (countHelper->hasData()) {
        std::array<char, 1024> temp;
        qsizetype bytesRead = countHelper->read(temp.data(), temp.size());
        if (bytesRead == -1)
            return false;
    }
    return true;
}